

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiArea::showEvent(QMdiArea *this,QShowEvent *showEvent)

{
  QMdiAreaPrivate *this_00;
  long lVar1;
  QArrayData *pQVar2;
  Rearranger **ppRVar3;
  Rearranger *rearranger;
  QPointer<QMdiSubWindow> *pQVar4;
  long lVar5;
  Data *pDVar6;
  QWidgetData *pQVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  undefined8 uVar11;
  QWidget *pQVar12;
  QSize QVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  QWidget *this_01;
  uint uVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  QSize local_60;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  lVar1 = (this_00->pendingRearrangements).d.size;
  if (lVar1 != 0) {
    pQVar2 = &((this_00->pendingRearrangements).d.d)->super_QArrayData;
    ppRVar3 = (this_00->pendingRearrangements).d.ptr;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    lVar17 = 0;
    bVar9 = false;
    do {
      rearranger = *(Rearranger **)((long)ppRVar3 + lVar17);
      iVar10 = (*rearranger->_vptr_Rearranger[1])(rearranger);
      bVar8 = true;
      if (bVar9) {
        bVar8 = bVar9;
      }
      if (iVar10 == 2) {
        bVar8 = bVar9;
      }
      QMdiAreaPrivate::rearrange(this_00,rearranger);
      lVar17 = lVar17 + 8;
      bVar9 = bVar8;
    } while (lVar1 << 3 != lVar17);
    QList<QMdi::Rearranger_*>::clear(&this_00->pendingRearrangements);
    if ((bVar8) && ((this_00->pendingPlacements).d.size != 0)) {
      QList<QPointer<QMdiSubWindow>_>::clear(&this_00->pendingPlacements);
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,8,0x10);
      }
    }
  }
  lVar1 = (this_00->pendingPlacements).d.size;
  if (lVar1 != 0) {
    local_58.d = (this_00->pendingPlacements).d.d;
    pQVar4 = (this_00->pendingPlacements).d.ptr;
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.ptr = pQVar4;
    local_58.size = lVar1;
    if (lVar1 != 0) {
      lVar17 = 0;
      do {
        lVar5 = *(long *)((long)&(pQVar4->wp).d + lVar17);
        if ((lVar5 == 0) || (*(int *)(lVar5 + 4) == 0)) {
          this_01 = (QWidget *)0x0;
        }
        else {
          this_01 = *(QWidget **)((long)&(pQVar4->wp).value + lVar17);
        }
        if (this_01 != (QWidget *)0x0) {
          if (((this_00->viewMode == TabbedView) &&
              (*(char *)(*(long *)&this_01->field_0x8 + 0x2db) == '\x01')) &&
             ((pDVar6 = (this_00->active).wp.d, pDVar6 == (Data *)0x0 ||
              ((*(int *)(pDVar6 + 4) == 0 || ((this_00->active).wp.value == (QObject *)0x0)))))) {
            this_00->showActiveWindowMaximized = true;
            QMdiAreaPrivate::emitWindowActivated(this_00,(QMdiSubWindow *)this_01);
          }
          else {
            bVar9 = QWidget::testAttribute_helper(this_01,WA_Resized);
            if (!bVar9) {
              uVar11 = (**(code **)(*(long *)this_01 + 0x70))(this_01);
              pQVar12 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
              pQVar7 = pQVar12->data;
              uVar14 = ((pQVar7->crect).x2.m_i - (pQVar7->crect).x1.m_i) + 1;
              uVar18 = (uint)uVar11;
              if ((int)uVar14 <= (int)(uint)uVar11) {
                uVar18 = uVar14;
              }
              uVar15 = ((pQVar7->crect).y2.m_i - (pQVar7->crect).y1.m_i) + 1;
              uVar14 = (uint)((ulong)uVar11 >> 0x20);
              if ((int)uVar15 <= (int)uVar14) {
                uVar14 = uVar15;
              }
              QVar13 = qSmartMinSize(this_01);
              uVar16 = (ulong)QVar13 >> 0x20;
              uVar19 = (ulong)uVar18;
              if ((int)uVar18 <= QVar13.wd.m_i.m_i) {
                uVar19 = (ulong)QVar13 & 0xffffffff;
              }
              if (QVar13.ht.m_i.m_i < (int)uVar14) {
                uVar16 = (ulong)uVar14;
              }
              local_60 = (QSize)(uVar19 | uVar16 << 0x20);
              QWidget::resize(this_01,&local_60);
            }
            bVar9 = QWidget::testAttribute_helper(this_01,WA_Moved);
            if (!bVar9) {
              bVar9 = QWidget::isMinimized(this_01);
              if (!bVar9) {
                bVar9 = QWidget::isMaximized(this_01);
                if (!bVar9) {
                  QMdiAreaPrivate::place(this_00,this_00->placer,(QMdiSubWindow *)this_01);
                }
              }
            }
          }
        }
        lVar17 = lVar17 + 0x10;
      } while (lVar1 << 4 != lVar17);
    }
    QList<QPointer<QMdiSubWindow>_>::clear(&this_00->pendingPlacements);
    QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_58);
  }
  QMdiAreaPrivate::setChildActivationEnabled(this_00,true,false);
  QMdiAreaPrivate::activateCurrentWindow(this_00);
  QWidget::showEvent((QWidget *)this,showEvent);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiArea::showEvent(QShowEvent *showEvent)
{
    Q_D(QMdiArea);
    if (!d->pendingRearrangements.isEmpty()) {
        bool skipPlacement = false;
        // Take a copy because d->rearrange() may modify d->pendingRearrangements
        const auto pendingRearrange = d->pendingRearrangements;
        for (Rearranger *rearranger : pendingRearrange) {
            // If this is the case, we don't have to lay out pending child windows
            // since the rearranger will find a placement for them.
            if (rearranger->type() != Rearranger::IconTiler && !skipPlacement)
                skipPlacement = true;
            d->rearrange(rearranger);
        }
        d->pendingRearrangements.clear();

        if (skipPlacement && !d->pendingPlacements.isEmpty())
            d->pendingPlacements.clear();
    }

    if (!d->pendingPlacements.isEmpty()) {
        // Nothing obvious in the loop body changes the container (in this code path)
        // during iteration, this is calling into a non-const method that does change
        // the container when called from other places. So take a copy anyway for good
        // measure.
        const auto copy = d->pendingPlacements;
        for (QMdiSubWindow *window : copy) {
            if (!window)
                continue;
            if (d->viewMode == TabbedView && window->d_func()->isActive && !d->active) {
                d->showActiveWindowMaximized = true;
                d->emitWindowActivated(window); // Also maximizes the window
                continue;
            }
            if (!window->testAttribute(Qt::WA_Resized)) {
                QSize newSize(window->sizeHint().boundedTo(viewport()->size()));
                window->resize(newSize.expandedTo(qSmartMinSize(window)));
            }
            if (!window->testAttribute(Qt::WA_Moved) && !window->isMinimized()
                    && !window->isMaximized()) {
                d->place(d->placer, window);
            }
        }
        d->pendingPlacements.clear();
    }

    d->setChildActivationEnabled(true);
    d->activateCurrentWindow();

    QAbstractScrollArea::showEvent(showEvent);
}